

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZStructMatrix.cpp
# Opt level: O0

void __thiscall TPZStructMatrix::SetMesh(TPZStructMatrix *this,TPZCompMesh *mesh)

{
  long in_RSI;
  long in_RDI;
  TPZCompMesh *in_stack_00000010;
  undefined8 local_20;
  
  *(long *)(in_RDI + 8) = in_RSI;
  if (in_RSI == 0) {
    local_20 = 0;
  }
  else {
    local_20 = TPZCompMesh::NEquations(in_stack_00000010);
  }
  TPZEquationFilter::SetNumEq((TPZEquationFilter *)(in_RDI + 0x48),local_20);
  return;
}

Assistant:

void TPZStructMatrix::SetMesh(TPZCompMesh *mesh) {
    fMesh = mesh;
    fEquationFilter.SetNumEq(mesh ? mesh->NEquations() : 0);
#ifdef PZDEBUG
    if (mesh) {
        TPZCheckMesh checkmesh(fMesh, &std::cout);
        if (checkmesh.CheckConnectSeqNumberConsistency() != 0) {
            DebugStop();
        }
    }
#endif
}